

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenGlobalInitializer.cxx
# Opt level: O1

void __thiscall
cmQtAutoGenGlobalInitializer::GetOrCreateGlobalTarget
          (cmQtAutoGenGlobalInitializer *this,cmLocalGenerator *localGen,string *name,
          string *comment)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *this_00;
  pointer pcVar2;
  char *pcVar3;
  _Head_base<0UL,_cmCustomCommand_*,_false> _Var4;
  cmGeneratorTarget *pcVar5;
  string *psVar6;
  cmTarget *t;
  tuple<cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_> this_01;
  cmState *this_02;
  cmValue value;
  char *__s;
  __single_object cc;
  _Head_base<0UL,_cmCustomCommand_*,_false> local_70;
  string local_68;
  __uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> local_48;
  __uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_40;
  cmMakefile *local_38;
  
  pcVar5 = cmLocalGenerator::FindGeneratorTargetToUse(localGen,name);
  if (pcVar5 == (cmGeneratorTarget *)0x0) {
    this_00 = localGen->Makefile;
    std::make_unique<cmCustomCommand>();
    _Var4._M_head_impl = local_70._M_head_impl;
    local_38 = this_00;
    psVar6 = cmMakefile::GetHomeOutputDirectory_abi_cxx11_(this_00);
    pcVar2 = (psVar6->_M_dataplus)._M_p;
    __s = "";
    if (pcVar2 != (pointer)0x0) {
      __s = pcVar2;
    }
    pcVar3 = (char *)((_Var4._M_head_impl)->WorkingDirectory)._M_string_length;
    strlen(__s);
    std::__cxx11::string::_M_replace
              ((ulong)&(_Var4._M_head_impl)->WorkingDirectory,0,pcVar3,(ulong)__s);
    cmCustomCommand::SetCMP0116Status(local_70._M_head_impl,NEW);
    cmCustomCommand::SetEscapeOldStyle(local_70._M_head_impl,false);
    cmCustomCommand::SetComment(local_70._M_head_impl,(comment->_M_dataplus)._M_p);
    local_40._M_t.super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
    super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
         (tuple<cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>)
         (tuple<cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>)local_70._M_head_impl;
    local_70._M_head_impl = (cmCustomCommand *)0x0;
    t = cmLocalGenerator::AddUtilityCommand
                  (localGen,name,true,
                   (unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&local_40);
    std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
              ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&local_40);
    this_01.super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>.
    super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>)
         operator_new(0x8c0);
    cmGeneratorTarget::cmGeneratorTarget
              ((cmGeneratorTarget *)
               this_01.
               super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>.
               super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl,t,localGen);
    local_48._M_t.
    super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>.
    super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl =
         (tuple<cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>)
         (tuple<cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>)
         this_01.
         super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>.
         super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl;
    cmLocalGenerator::AddGeneratorTarget
              (localGen,(unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *)
                        &local_48);
    std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::~unique_ptr
              ((unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *)&local_48);
    this_02 = cmMakefile::GetState(local_38);
    paVar1 = &local_68.field_2;
    local_68._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"AUTOGEN_TARGETS_FOLDER","")
    ;
    value = cmState::GetGlobalProperty(this_02,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if (value.Value != (string *)0x0) {
      local_68._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"FOLDER","");
      cmTarget::SetProperty(t,&local_68,value);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != paVar1) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
    }
    std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
              ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&local_70);
  }
  return;
}

Assistant:

void cmQtAutoGenGlobalInitializer::GetOrCreateGlobalTarget(
  cmLocalGenerator* localGen, std::string const& name,
  std::string const& comment)
{
  // Test if the target already exists
  if (localGen->FindGeneratorTargetToUse(name) == nullptr) {
    cmMakefile* makefile = localGen->GetMakefile();

    // Create utility target
    auto cc = cm::make_unique<cmCustomCommand>();
    cc->SetWorkingDirectory(makefile->GetHomeOutputDirectory().c_str());
    cc->SetCMP0116Status(cmPolicies::NEW);
    cc->SetEscapeOldStyle(false);
    cc->SetComment(comment.c_str());
    cmTarget* target = localGen->AddUtilityCommand(name, true, std::move(cc));
    localGen->AddGeneratorTarget(
      cm::make_unique<cmGeneratorTarget>(target, localGen));

    // Set FOLDER property in the target
    {
      cmValue folder =
        makefile->GetState()->GetGlobalProperty("AUTOGEN_TARGETS_FOLDER");
      if (folder) {
        target->SetProperty("FOLDER", folder);
      }
    }
  }
}